

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# porting.c
# Opt level: O3

int uni_thread_new(char *name,_func_void_ptr_void_ptr *fn,void *arg,int stack_size)

{
  int iVar1;
  int iVar2;
  pthread_t pid;
  pthread_attr_t attr;
  pthread_t local_60;
  pthread_attr_t local_58;
  
  pthread_attr_init(&local_58);
  pthread_attr_setstacksize(&local_58,(long)stack_size);
  iVar1 = pthread_create(&local_60,&local_58,(__start_routine *)fn,arg);
  iVar2 = -3;
  if (iVar1 == 0) {
    pthread_detach(local_60);
    iVar2 = 0;
  }
  pthread_attr_destroy(&local_58);
  return iVar2;
}

Assistant:

int uni_thread_new(const char *name, void* (*fn)(void *), void *arg, int stack_size) {
    pthread_t pid;
    pthread_attr_t attr;
    pthread_attr_init(&attr);
    pthread_attr_setstacksize(&attr, stack_size);
    if (0 != pthread_create(&pid, &attr, fn, arg)) {
        pthread_attr_destroy(&attr);
        return -CREATE_TASK_FAIL;
    }

    pthread_detach(pid);
    pthread_attr_destroy(&attr);
    return OK;
}